

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O0

Vec3f embree::string_to_Vec3f(string *str)

{
  string *in_RSI;
  string *in_RDI;
  undefined4 in_XMM1_Da;
  Vec3f VVar1;
  float z;
  float y;
  float x;
  size_t next;
  string local_88 [36];
  float local_64;
  string local_60 [36];
  float local_3c;
  undefined8 local_38;
  
  local_38 = 0;
  local_3c = std::__cxx11::stof(in_RDI,(size_t *)in_RSI);
  std::__cxx11::string::substr((ulong)local_60,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_60);
  std::__cxx11::string::~string(local_60);
  local_64 = std::__cxx11::stof(in_RDI,(size_t *)in_RSI);
  std::__cxx11::string::substr((ulong)local_88,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_88);
  std::__cxx11::string::~string(local_88);
  VVar1.field_0._0_4_ = std::__cxx11::stof(in_RDI,(size_t *)in_RSI);
  *(float *)in_RDI = local_3c;
  *(float *)&in_RDI->field_0x4 = local_64;
  VVar1.field_0.field_0.y = 0.0;
  *(float *)&in_RDI->_M_string_length = VVar1.field_0._0_4_;
  VVar1.field_0.field_0.z = (float)in_XMM1_Da;
  return (Vec3f)VVar1.field_0;
}

Assistant:

Vec3f string_to_Vec3f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next); str = str.substr(next+1);
    const float z = std::stof(str,&next); 
    return Vec3f(x,y,z);
  }